

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

ostream * std::operator<<(ostream *ofs,LayerOffset *v)

{
  ostream *poVar1;
  char *pcVar2;
  double v_00;
  string local_78;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  string local_38;
  
  local_48 = ABS(v->_offset);
  local_58 = ABS(v->_scale + -1.0);
  if ((2.220446049250313e-16 <= local_48) || (2.220446049250313e-16 <= local_58)) {
    uStack_50 = 0;
    uStack_40 = 0;
    std::__ostream_insert<char,std::char_traits<char>>(ofs,"(",1);
    if ((local_48 < 2.220446049250313e-16) || (local_58 < 2.220446049250313e-16)) {
      if (local_48 < 2.220446049250313e-16) {
        pcVar2 = "scale = ";
        std::__ostream_insert<char,std::char_traits<char>>(ofs,"scale = ",8);
        v_00 = v->_scale;
      }
      else {
        pcVar2 = "offset = ";
        std::__ostream_insert<char,std::char_traits<char>>(ofs,"offset = ",9);
        v_00 = v->_offset;
      }
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)pcVar2,v_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (ofs,local_78._M_dataplus._M_p,local_78._M_string_length);
    }
    else {
      pcVar2 = "offset = ";
      std::__ostream_insert<char,std::char_traits<char>>(ofs,"offset = ",9);
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)pcVar2,v->_offset);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (ofs,local_78._M_dataplus._M_p,local_78._M_string_length);
      pcVar2 = ", scale = ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", scale = ",10);
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_38,(_anonymous_namespace_ *)pcVar2,v->_scale);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(ofs,")",1);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::LayerOffset &v) {
  bool print_offset{true};
  bool print_scale{true};

  if (std::fabs(v._offset) < std::numeric_limits<double>::epsilon()) {
    print_offset = false;
  }

  if (std::fabs(v._scale - 1.0) < std::numeric_limits<double>::epsilon()) {
    print_scale = false;
  }

  if (!print_offset && !print_scale) {
    // No need to print LayerOffset.
    return ofs;
  }

  // TODO: Do not print scale when it is 1.0
  ofs << "(";
  if (print_offset && print_scale) {
    ofs << "offset = " << tinyusdz::dtos(v._offset)
        << ", scale = " << tinyusdz::dtos(v._scale);
  } else if (print_offset) {
    ofs << "offset = " << tinyusdz::dtos(v._offset);
  } else {  // print_scale
    ofs << "scale = " << tinyusdz::dtos(v._scale);
  }
  ofs << ")";

  return ofs;
}